

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O2

ssize_t __thiscall pstore::brokerface::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  char local_34;
  
  uVar1 = this->max_retries_;
  uVar4 = 0;
  uVar2 = uVar1;
  do {
    if (uVar2 < uVar4 && uVar1 != 0xffffffff) {
LAB_001d41e4:
      if (((uVar1 != 0xffffffff) && (local_34 = (char)__buf, local_34 != '\0')) && (uVar2 < uVar4))
      {
        raise<pstore::error_code>(pipe_write_timeout);
      }
      return (ulong)uVar2;
    }
    std::function<void_()>::operator()(&this->update_cb_);
    iVar3 = (*this->_vptr_writer[2])(this,CONCAT44(in_register_00000034,__fd));
    if ((char)iVar3 != '\0') {
      uVar2 = this->max_retries_;
      goto LAB_001d41e4;
    }
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&this->retry_timeout_);
    uVar4 = uVar4 + 1;
    uVar2 = this->max_retries_;
  } while( true );
}

Assistant:

void writer::write (message_type const & msg, bool const error_on_timeout) {
            auto tries = 0U;
            bool const infinite_tries = max_retries_ == infinite_retries;
            for (; infinite_tries || tries <= max_retries_; ++tries) {
                update_cb_ ();
                if (this->write_impl (msg)) {
                    break;
                }
                std::this_thread::sleep_for (retry_timeout_);
            }

            if (error_on_timeout && !infinite_tries && tries > max_retries_) {
                raise (::pstore::error_code::pipe_write_timeout);
            }
        }